

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

int64_t cab_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  int64_t iVar1;
  long local_50;
  ssize_t avail;
  long lStack_40;
  wchar_t err;
  int64_t rbytes;
  int64_t cbytes;
  cfdata *cfdata;
  cab *cab;
  int64_t consumed_bytes_local;
  archive_read *a_local;
  
  cfdata = (cfdata *)a->format->data;
  cab = (cab *)consumed_bytes;
  consumed_bytes_local = (int64_t)a;
  lStack_40 = cab_minimum_consume_cfdata(a,consumed_bytes);
  if (-1 < lStack_40) {
    cbytes = (int64_t)cfdata->sum_ptr;
    do {
      while( true ) {
        while( true ) {
          if (lStack_40 < 1) {
            return (int64_t)cab;
          }
          if (*(short *)(cbytes + 4) == 0) {
            archive_set_error((archive *)consumed_bytes_local,0x54,"Invalid CFDATA");
            return -0x1e;
          }
          rbytes = (int64_t)*(ushort *)(cbytes + 10);
          if (lStack_40 < rbytes) {
            rbytes = lStack_40;
          }
          lStack_40 = lStack_40 - rbytes;
          if ((*(short *)(cbytes + 0xc) != 0) ||
             ((*(short *)(*(long *)&cfdata->sum_extra_avail + 0x10) != -1 &&
              (*(short *)(*(long *)&cfdata->sum_extra_avail + 0x10) != -3)))) break;
          if (rbytes != (ulong)*(ushort *)(cbytes + 10)) {
            *(short *)(cbytes + 0xe) = *(short *)(cbytes + 0xe) + (short)rbytes;
            *(short *)(cbytes + 10) = *(short *)(cbytes + 10) - (short)rbytes;
            return (int64_t)cab;
          }
          __archive_read_consume
                    ((archive_read *)consumed_bytes_local,(ulong)*(ushort *)(cbytes + 4));
          *(ulong *)(cfdata + 1) = (ulong)*(ushort *)(cbytes + 4) + *(long *)(cfdata + 1);
          *(undefined2 *)(cbytes + 6) = 0;
          *(undefined2 *)(cbytes + 10) = 0;
          avail._4_4_ = cab_next_cfdata((archive_read *)consumed_bytes_local);
          if (avail._4_4_ < L'\0') {
            return (long)avail._4_4_;
          }
          cbytes = (int64_t)cfdata->sum_ptr;
          if ((*(short *)(cbytes + 8) == 0) &&
             (*(ushort *)(*(long *)&cfdata->sum_extra_avail + 0x10) - 0xfffd < 3)) {
            lStack_40 = 0;
          }
        }
        if (rbytes == 0) break;
        for (; 0 < rbytes; rbytes = rbytes - local_50) {
          cab_read_ahead_cfdata((archive_read *)consumed_bytes_local,&local_50);
          if (local_50 < 1) {
            return -0x1e;
          }
          if (rbytes < local_50) {
            local_50 = rbytes;
          }
          iVar1 = cab_minimum_consume_cfdata((archive_read *)consumed_bytes_local,local_50);
          if (iVar1 < 0) {
            return -0x1e;
          }
        }
      }
      avail._4_4_ = cab_next_cfdata((archive_read *)consumed_bytes_local);
      if (avail._4_4_ < L'\0') {
        return (long)avail._4_4_;
      }
      cbytes = (int64_t)cfdata->sum_ptr;
    } while ((*(short *)(cbytes + 8) != 0) ||
            (2 < *(ushort *)(*(long *)&cfdata->sum_extra_avail + 0x10) - 0xfffd));
  }
  return -0x1e;
}

Assistant:

static int64_t
cab_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	rbytes = cab_minimum_consume_cfdata(a, consumed_bytes);
	if (rbytes < 0)
		return (ARCHIVE_FATAL);

	cfdata = cab->entry_cfdata;
	while (rbytes > 0) {
		ssize_t avail;

		if (cfdata->compressed_size == 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Invalid CFDATA");
			return (ARCHIVE_FATAL);
		}
		cbytes = cfdata->uncompressed_bytes_remaining;
		if (cbytes > rbytes)
			cbytes = rbytes;
		rbytes -= cbytes;

		if (cfdata->uncompressed_avail == 0 &&
		   (cab->entry_cffile->folder == iFoldCONTINUED_PREV_AND_NEXT ||
		    cab->entry_cffile->folder == iFoldCONTINUED_FROM_PREV)) {
			/* We have not read any data yet. */
			if (cbytes == cfdata->uncompressed_bytes_remaining) {
				/* Skip whole current CFDATA. */
				__archive_read_consume(a,
				    cfdata->compressed_size);
				cab->cab_offset += cfdata->compressed_size;
				cfdata->compressed_bytes_remaining = 0;
				cfdata->uncompressed_bytes_remaining = 0;
				err = cab_next_cfdata(a);
				if (err < 0)
					return (err);
				cfdata = cab->entry_cfdata;
				if (cfdata->uncompressed_size == 0) {
					switch (cab->entry_cffile->folder) {
					case iFoldCONTINUED_PREV_AND_NEXT:
					case iFoldCONTINUED_TO_NEXT:
					case iFoldCONTINUED_FROM_PREV:
						rbytes = 0;
						break;
					default:
						break;
					}
				}
				continue;
			}
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
			break;
		} else if (cbytes == 0) {
			err = cab_next_cfdata(a);
			if (err < 0)
				return (err);
			cfdata = cab->entry_cfdata;
			if (cfdata->uncompressed_size == 0) {
				switch (cab->entry_cffile->folder) {
				case iFoldCONTINUED_PREV_AND_NEXT:
				case iFoldCONTINUED_TO_NEXT:
				case iFoldCONTINUED_FROM_PREV:
					return (ARCHIVE_FATAL);
				default:
					break;
				}
			}
			continue;
		}
		while (cbytes > 0) {
			(void)cab_read_ahead_cfdata(a, &avail);
			if (avail <= 0)
				return (ARCHIVE_FATAL);
			if (avail > cbytes)
				avail = (ssize_t)cbytes;
			if (cab_minimum_consume_cfdata(a, avail) < 0)
				return (ARCHIVE_FATAL);
			cbytes -= avail;
		}
	}
	return (consumed_bytes);
}